

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void CLPIParser::parseProgramInfo
               (uint8_t *buffer,uint8_t *end,
               vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_> *programInfoMap,
               map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
               *streamInfoMap)

{
  vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_> *pvVar1;
  uint uVar2;
  uint uVar3;
  mapped_type *this;
  ulong uVar4;
  uint local_bc;
  vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_> *local_b8;
  ulong local_b0;
  map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
  *local_a8;
  BitStreamReader reader;
  CLPIStreamInfo streamInfo;
  
  reader.super_BitStream.m_totalBits = 0;
  reader.super_BitStream.m_buffer = (uint *)0x0;
  reader.super_BitStream.m_initBuffer = (uint *)0x0;
  reader.m_curVal = 0;
  reader.m_bitLeft = 0;
  local_b8 = programInfoMap;
  local_a8 = streamInfoMap;
  BitStreamReader::setBuffer(&reader,buffer,end);
  BitStreamReader::skipBits(&reader,0x20);
  BitStreamReader::skipBits(&reader,8);
  uVar2 = BitStreamReader::getBits(&reader,8);
  local_b0 = (ulong)(uVar2 & 0xff);
  for (uVar4 = 0; pvVar1 = local_b8, uVar4 != local_b0; uVar4 = uVar4 + 1) {
    std::vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>::emplace_back<>(local_b8);
    uVar2 = BitStreamReader::getBits(&reader,0x20);
    (pvVar1->super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar4].SPN_program_sequence_start = uVar2;
    uVar2 = BitStreamReader::getBits(&reader,0x10);
    (pvVar1->super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar4].program_map_PID = (uint16_t)uVar2;
    uVar2 = BitStreamReader::getBits(&reader,8);
    (pvVar1->super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar4].number_of_streams_in_ps = (uint8_t)uVar2;
    BitStreamReader::skipBits(&reader,8);
    for (uVar2 = 0;
        uVar2 < (local_b8->super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar4].number_of_streams_in_ps;
        uVar2 = uVar2 + 1) {
      uVar3 = BitStreamReader::getBits(&reader,0x10);
      streamInfo.super_M2TSStreamInfo.streamPID = 0;
      streamInfo.super_M2TSStreamInfo.stream_coding_type = RESERVED;
      streamInfo.super_M2TSStreamInfo.video_format = '\0';
      streamInfo.super_M2TSStreamInfo.frame_rate_index = '\x03';
      streamInfo.super_M2TSStreamInfo.aspect_ratio_index = '\0';
      streamInfo.super_M2TSStreamInfo.audio_presentation_type = '\0';
      streamInfo.super_M2TSStreamInfo.sampling_frequency_index = '\0';
      streamInfo.super_M2TSStreamInfo.character_code = '\0';
      streamInfo.super_M2TSStreamInfo.language_code[0] = '\0';
      streamInfo.super_M2TSStreamInfo.language_code[1] = '\0';
      streamInfo.super_M2TSStreamInfo.language_code[2] = '\0';
      streamInfo.super_M2TSStreamInfo.language_code[3] = '\0';
      streamInfo.super_M2TSStreamInfo.isSecondary = false;
      streamInfo.super_M2TSStreamInfo.number_of_offset_sequences = 0;
      streamInfo.super_M2TSStreamInfo.width = 0;
      streamInfo.super_M2TSStreamInfo.height._0_1_ = 0;
      streamInfo.super_M2TSStreamInfo._21_7_ = 0;
      streamInfo.super_M2TSStreamInfo.m_index.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      streamInfo.country_code[0] = '\0';
      streamInfo.country_code[1] = '\0';
      streamInfo.country_code[2] = '\0';
      streamInfo.copyright_holder[0] = '\0';
      streamInfo.copyright_holder[1] = '\0';
      streamInfo.copyright_holder[2] = '\0';
      streamInfo.copyright_holder[3] = '\0';
      streamInfo.recording_year[0] = '\0';
      streamInfo.super_M2TSStreamInfo.m_index.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      streamInfo.super_M2TSStreamInfo.m_index.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      streamInfo.recording_year[1] = '\0';
      streamInfo.recording_year[2] = '\0';
      streamInfo.recording_number[0] = '\0';
      streamInfo.recording_number[1] = '\0';
      streamInfo.recording_number[2] = '\0';
      streamInfo.recording_number[3] = '\0';
      streamInfo.recording_number[4] = '\0';
      streamInfo.recording_number[5] = '\0';
      CLPIStreamInfo::parseStreamCodingInfo(&streamInfo,&reader);
      local_bc = uVar3 & 0xffff;
      this = std::
             map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
             ::operator[](local_a8,(key_type_conflict *)&local_bc);
      CLPIStreamInfo::operator=(this,&streamInfo);
      std::
      vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ::~vector(&streamInfo.super_M2TSStreamInfo.m_index);
    }
  }
  return;
}

Assistant:

void CLPIParser::parseProgramInfo(uint8_t* buffer, const uint8_t* end, std::vector<CLPIProgramInfo>& programInfoMap,
                                  std::map<int, CLPIStreamInfo>& streamInfoMap)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, end);
    reader.skipBits(32);  // length
    reader.skipBits(8);   // reserved_for_word_align
    const auto number_of_program_sequences = reader.getBits<uint8_t>(8);
    for (int i = 0; i < number_of_program_sequences; i++)
    {
        programInfoMap.emplace_back();
        programInfoMap[i].SPN_program_sequence_start = reader.getBits(32);
        programInfoMap[i].program_map_PID = reader.getBits<uint16_t>(16);
        programInfoMap[i].number_of_streams_in_ps = reader.getBits<uint8_t>(8);
        reader.skipBits(8);
        for (int stream_index = 0; stream_index < programInfoMap[i].number_of_streams_in_ps; stream_index++)
        {
            const auto pid = reader.getBits<uint16_t>(16);
            CLPIStreamInfo streamInfo;
            streamInfo.parseStreamCodingInfo(reader);
            streamInfoMap[pid] = streamInfo;
        }
    }
}